

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

uint8_t * JS_WriteObject2(JSContext *ctx,size_t *psize,JSValue obj,int flags,uint8_t ***psab_tab,
                         size_t *psab_tab_len)

{
  JSGCObjectHeader *pJVar1;
  JSGCObjectHeader *pJVar2;
  JSGCObjectHeader *pJVar3;
  int iVar4;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  int64_t *in_R9;
  BCWriterState *s;
  BCWriterState ss;
  DynBuf *in_stack_ffffffffffffff28;
  JSContext *ctx_00;
  BCWriterState *in_stack_ffffffffffffff78;
  BCWriterState *in_stack_ffffffffffffff98;
  JSValue in_stack_ffffffffffffffa0;
  list_head *local_8;
  
  ctx_00 = (JSContext *)&stack0xffffffffffffff38;
  memset(ctx_00,0,0x90);
  pJVar1 = &ctx_00->header;
  pJVar2 = &ctx_00->header;
  pJVar3 = &ctx_00->header;
  (ctx_00->header).ref_count = (int)in_RDI;
  pJVar1->field_0x4 = (char)((ulong)in_RDI >> 0x20);
  pJVar2->dummy1 = (char)((ulong)in_RDI >> 0x28);
  pJVar3->dummy2 = (short)((ulong)in_RDI >> 0x30);
  *(uint *)&ctx_00->array_shape =
       *(uint *)&ctx_00->array_shape & 0xffffff00 | (uint)((in_R8D & 2) != 0);
  *(uint *)&ctx_00->array_shape =
       *(uint *)&ctx_00->array_shape & 0xffff00ff | (uint)((in_R8D & 1) != 0) << 8;
  *(uint *)&ctx_00->array_shape =
       *(uint *)&ctx_00->array_shape & 0xff00ffff | (uint)((in_R8D & 4) != 0) << 0x10;
  *(uint *)&ctx_00->array_shape =
       *(uint *)&ctx_00->array_shape & 0xffffff | (uint)((in_R8D & 8) != 0) << 0x18;
  if ((*(int *)&ctx_00->array_shape << 0x10) >> 0x18 == 0) {
    *(undefined4 *)((long)&ctx_00->array_shape + 4) = 1;
  }
  else {
    *(undefined4 *)((long)&ctx_00->array_shape + 4) = 0xd2;
  }
  js_dbuf_init(ctx_00,in_stack_ffffffffffffff28);
  js_object_list_init((JSObjectList *)0x1440ec);
  iVar4 = JS_WriteObjectRec(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  if ((iVar4 == 0) && (iVar4 = JS_WriteObjectAtoms(in_stack_ffffffffffffff78), iVar4 == 0)) {
    js_object_list_end(ctx_00,(JSObjectList *)in_stack_ffffffffffffff28);
    js_free(ctx_00,in_stack_ffffffffffffff28);
    js_free(ctx_00,in_stack_ffffffffffffff28);
    *in_RSI = (ctx_00->header).link.next;
    if (in_R9 != (int64_t *)0x0) {
      *in_R9 = (ctx_00->function_ctor).tag;
    }
    if (s != (BCWriterState *)0x0) {
      s->ctx = (JSContext *)(long)(ctx_00->array_ctor).u.int32;
    }
    local_8 = (ctx_00->header).link.prev;
  }
  else {
    js_object_list_end(ctx_00,(JSObjectList *)in_stack_ffffffffffffff28);
    js_free(ctx_00,in_stack_ffffffffffffff28);
    js_free(ctx_00,in_stack_ffffffffffffff28);
    dbuf_free((DynBuf *)0x14421e);
    *in_RSI = 0;
    if (in_R9 != (int64_t *)0x0) {
      *in_R9 = 0;
    }
    if (s != (BCWriterState *)0x0) {
      s->ctx = (JSContext *)0x0;
    }
    local_8 = (list_head *)0x0;
  }
  return (uint8_t *)local_8;
}

Assistant:

uint8_t *JS_WriteObject2(JSContext *ctx, size_t *psize, JSValueConst obj,
                         int flags, uint8_t ***psab_tab, size_t *psab_tab_len)
{
    BCWriterState ss, *s = &ss;

    memset(s, 0, sizeof(*s));
    s->ctx = ctx;
    /* XXX: byte swapped output is untested */
    s->byte_swap = ((flags & JS_WRITE_OBJ_BSWAP) != 0);
    s->allow_bytecode = ((flags & JS_WRITE_OBJ_BYTECODE) != 0);
    s->allow_sab = ((flags & JS_WRITE_OBJ_SAB) != 0);
    s->allow_reference = ((flags & JS_WRITE_OBJ_REFERENCE) != 0);
    /* XXX: could use a different version when bytecode is included */
    if (s->allow_bytecode)
        s->first_atom = JS_ATOM_END;
    else
        s->first_atom = 1;
    js_dbuf_init(ctx, &s->dbuf);
    js_object_list_init(&s->object_list);
    
    if (JS_WriteObjectRec(s, obj))
        goto fail;
    if (JS_WriteObjectAtoms(s))
        goto fail;
    js_object_list_end(ctx, &s->object_list);
    js_free(ctx, s->atom_to_idx);
    js_free(ctx, s->idx_to_atom);
    *psize = s->dbuf.size;
    if (psab_tab)
        *psab_tab = s->sab_tab;
    if (psab_tab_len)
        *psab_tab_len = s->sab_tab_len;
    return s->dbuf.buf;
 fail:
    js_object_list_end(ctx, &s->object_list);
    js_free(ctx, s->atom_to_idx);
    js_free(ctx, s->idx_to_atom);
    dbuf_free(&s->dbuf);
    *psize = 0;
    if (psab_tab)
        *psab_tab = NULL;
    if (psab_tab_len)
        *psab_tab_len = 0;
    return NULL;
}